

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ypspur-interpreter.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  char *pcVar10;
  int coordinate;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  double th;
  double y;
  double x;
  char text [16];
  char ip [64];
  option options [9];
  
  coordinate = 4;
  memcpy(options,&PTR_anon_var_dwarf_22f_00107c90,0x120);
  hook_pre_global();
  bVar4 = true;
  local_1c8 = 0.0;
  local_1d0 = 0.0;
  local_1d8 = 0.0;
  local_1e0 = 0.0;
  bVar2 = false;
  bVar1 = false;
  bVar3 = false;
  iVar7 = 0;
  iVar8 = 0;
LAB_00102ed1:
  do {
    iVar6 = getopt_long(argc,argv,"V:W:A:O:c:q:s:h",options,0);
    if (iVar6 == -1) {
      signal(2,ctrlc);
      if (iVar7 == -1) {
        YPSpur_init_socket(ip,iVar8);
      }
      else if (iVar7 == 0) {
        YPSpur_init();
      }
      else {
        YPSpur_initex(iVar7);
      }
      if (!bVar4) {
        YPSpur_set_vel(local_1c8);
      }
      if (bVar1) {
        YPSpur_set_angvel(local_1d0);
      }
      if (bVar2) {
        YPSpur_set_accel(local_1d8);
      }
      if (bVar3) {
        YPSpur_set_angaccel(local_1e0);
      }
      using_history();
      read_history(".spurip_history");
      uVar9 = 1;
      while( true ) {
        bVar5 = false;
        while( true ) {
          while( true ) {
            if (uVar9 == 0) goto LAB_00103311;
            iVar6 = __sigsetjmp(ctrlc_capture,1);
            if (iVar6 == 0) break;
            write_history(".spurip_history");
            uVar9 = 1;
          }
          YPSpur_get_pos(2,&x,&y,&th);
          iVar6 = YP_get_error_state();
          if (iVar6 == 0) break;
          if (iVar7 == -1) {
            YPSpur_init_socket(ip,iVar8);
          }
          else if (iVar7 == 0) {
            YPSpur_init();
          }
          else {
            YPSpur_initex(iVar7);
          }
          if (!bVar4) {
            YPSpur_set_vel(local_1c8);
          }
          if (bVar1) {
            YPSpur_set_angvel(local_1d0);
          }
          if (bVar2) {
            YPSpur_set_accel(local_1d8);
          }
          if (bVar3) {
            YPSpur_set_angaccel(local_1e0);
          }
          if (!bVar5) {
            fwrite("WARN: YPSpur-coordinator terminated.\n",0x25,1,_stderr);
            fflush(_stderr);
            signal(2,(__sighandler_t)0x0);
          }
          yp_usleep(50000);
          uVar9 = 1;
          bVar5 = true;
        }
        if (bVar5) {
          fwrite("INFO: YPSpur-coordinator started.\n",0x22,1,_stderr);
          fflush(_stderr);
          signal(2,ctrlc);
        }
        snprintf(text,0x10,"%s> ",YPSpur_CSName + coordinate);
        main::line_prev = main::line;
        pcVar10 = (char *)readline(text);
        main::line = pcVar10;
        if (pcVar10 == (char *)0x0) break;
        if ((*pcVar10 != '\0') &&
           ((main::line_prev == (char *)0x0 || (iVar6 = strcmp(pcVar10,main::line_prev), iVar6 != 0)
            ))) {
          add_history(pcVar10);
        }
        uVar9 = proc_spur(main::line,&coordinate);
        uVar9 = ~uVar9 >> 0x1f;
        free(main::line_prev);
      }
LAB_00103311:
      putchar(10);
      write_history(".spurip_history");
      return 0;
    }
    if (iVar6 == 0x41) {
      local_1d8 = atof(_optarg);
      bVar2 = true;
      goto LAB_00102ed1;
    }
    if (iVar6 != 0x4f) {
      if (iVar6 != 0x73) {
        if (iVar6 == 0x57) {
          local_1d0 = atof(_optarg);
          bVar1 = true;
          goto LAB_00102ed1;
        }
        if (iVar6 == 99) {
          if (iVar7 == 0) {
            YPSpur_init();
          }
          else if (iVar7 == -1) {
            YPSpur_init_socket(ip,iVar8);
          }
          else {
            YPSpur_initex(iVar7);
          }
          proc_spur(_optarg,&coordinate);
        }
        else {
          if (iVar6 != 0x68) {
            if (iVar6 == 0x71) {
              iVar7 = atoi(_optarg);
            }
            else if (iVar6 == 0x56) {
              local_1c8 = atof(_optarg);
              bVar4 = false;
            }
            goto LAB_00102ed1;
          }
          print_help(argv);
        }
        return 1;
      }
      strncpy(ip,_optarg,0x40);
      pcVar10 = strchr(ip,0x3a);
      if (pcVar10 == (char *)0x0) {
        fprintf(_stderr,"USAGE: %s -s ip:port\n",*argv);
        return -1;
      }
      *pcVar10 = '\0';
      iVar8 = atoi(pcVar10 + 1);
      iVar7 = -1;
      goto LAB_00102ed1;
    }
    local_1e0 = atof(_optarg);
    bVar3 = true;
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
  int coordinate = CS_FS;
  char ip[64];
  int port = 0;
  int active = 1;
  int err = 0;
  double vel = 0;
  double angvel = 0;
  double accel = 0;
  double angaccel = 0;
  int set_vel = 0;
  int set_accel = 0;
  int set_angvel = 0;
  int set_angaccel = 0;
  int msqid = 0;
  struct option options[9] =
      {
          {"set-vel", 1, 0, 'V'},
          {"set-angvel", 1, 0, 'W'},
          {"set-accel", 1, 0, 'A'},
          {"set-angaccel", 1, 0, 'O'},
          {"command", 1, 0, 'c'},
          {"msq-id", 1, 0, 'q'},
          {"socket", 1, 0, 's'},
          {"help", 0, 0, 'h'},
          {0, 0, 0, 0}};
  int opt;

  hook_pre_global();

  while ((opt = getopt_long(argc, argv, "V:W:A:O:c:q:s:h", options, NULL)) != -1)
  {
    switch (opt)
    {
      case 'V':
        vel = atof(optarg);
        set_vel = 1;
        break;
      case 'W':
        angvel = atof(optarg);
        set_angvel = 1;
        break;
      case 'A':
        accel = atof(optarg);
        set_accel = 1;
        break;
      case 'O':
        angaccel = atof(optarg);
        set_angaccel = 1;
        break;
      case 'c':
        if (msqid == -1)
          YPSpur_init_socket(ip, port);
        else if (msqid == 0)
          YPSpur_init();
        else
          YPSpur_initex(msqid);
        proc_spur(optarg, &coordinate);
        return 1;
        break;
      case 'q':
        msqid = atoi(optarg);
        break;
      case 's':
        strncpy(ip, optarg, 64);
        {
          char* p;
          p = strchr(ip, ':');
          if (p == NULL)
          {
            fprintf(stderr, "USAGE: %s -s ip:port\n", argv[0]);
            return -1;
          }
          *p = 0;
          port = atoi(p + 1);
          msqid = -1;
        }
        break;
      case 'h':
        print_help(argv);
        return 1;
        break;
      default:
        break;
    }
  }

#if HAVE_SIGLONGJMP
  signal(SIGINT, ctrlc);
#endif  // HAVE_SIGLONGJMP

  if (msqid == -1)
    YPSpur_init_socket(ip, port);
  else if (msqid == 0)
    YPSpur_init();
  else
    YPSpur_initex(msqid);

  if (set_vel)
    YPSpur_set_vel(vel);
  if (set_angvel)
    YPSpur_set_angvel(angvel);
  if (set_accel)
    YPSpur_set_accel(accel);
  if (set_angaccel)
    YPSpur_set_angaccel(angaccel);

#if HAVE_LIBREADLINE
  using_history();
  read_history(".spurip_history");
#endif  // HAVE_LIBREADLINE
  while (active)
  {
    static char* line = NULL;
    static char* line_prev = NULL;
    char text[16];
#if !HAVE_LIBREADLINE
#if HAVE_GETLINE
    size_t len;
#endif  // HAVE_GETLINE
#endif  // !HAVE_LIBREADLINE
#if HAVE_SIGLONGJMP
    if (sigsetjmp(ctrlc_capture, 1) != 0)
    {
#if HAVE_LIBREADLINE
      write_history(".spurip_history");
#endif  // HAVE_LIBREADLINE
    }
    else
#endif  // HAVE_SIGLONGJMP
    {
      {
        // Dummy for error checking
        double x, y, th;
        YPSpur_get_pos(CS_GL, &x, &y, &th);
      }
      if (YP_get_error_state())
      {
        if (msqid == -1)
          YPSpur_init_socket(ip, port);
        else if (msqid == 0)
          YPSpur_init();
        else
          YPSpur_initex(msqid);
        if (set_vel)
          YPSpur_set_vel(vel);
        if (set_angvel)
          YPSpur_set_angvel(angvel);
        if (set_accel)
          YPSpur_set_accel(accel);
        if (set_angaccel)
          YPSpur_set_angaccel(angaccel);
        if (err == 0)
        {
          fprintf(stderr, "WARN: YPSpur-coordinator terminated.\n");
          fflush(stderr);
#if HAVE_SIGLONGJMP
          signal(SIGINT, NULL);
#endif  // HAVE_SIGLONGJMP
        }
        err = 1;
        yp_usleep(50000);
        continue;
      }
      else
      {
        if (err == 1)
        {
          fprintf(stderr, "INFO: YPSpur-coordinator started.\n");
          fflush(stderr);
#if HAVE_SIGLONGJMP
          signal(SIGINT, ctrlc);
#endif  // HAVE_SIGLONGJMP
        }
      }
      err = 0;

      snprintf(text, sizeof(text), "%s> ", YPSpur_CSName[coordinate]);
#if HAVE_LIBREADLINE
      line_prev = line;
      line = readline(text);
      if (!line)
      {
        // EOF
        break;
      }
      if (strlen(line) > 0)
      {
        if (line && line_prev)
        {
          if (strcmp(line, line_prev) != 0)
          {
            add_history(line);
          }
        }
        else
        {
          add_history(line);
        }
      }
#else
      printf("%s", text);
      fflush(stdout);
      line = NULL;
#if HAVE_GETLINE
      len = 0;
      getline(&line, &len, stdin);
      if (len == 0)
        continue;
#else
      line = malloc(512);
      fgets(line, 512, stdin);
#endif  // HAVE_GETLINE
      line_prev = line;
#endif  // HAVE_LIBREADLINE
      if (proc_spur(line, &coordinate) < 0)
      {
        active = 0;
      }

      if (line_prev)
        free(line_prev);
    }
  }
  printf("\n");
#if HAVE_LIBREADLINE
  write_history(".spurip_history");
#endif  // HAVE_LIBREADLINE

  return 0;
}